

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall
PeleLM::getForce(PeleLM *this,FArrayBox *force,Box *bx,int scomp,int ncomp,Real time,FArrayBox *Vel,
                FArrayBox *Scal,int scalScomp,MFIter *mfi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  Real RVar10;
  int iVar11;
  Real RVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  undefined8 *puVar17;
  long lVar18;
  int *piVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined8 *puVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined8 *puVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int n;
  ulong uVar38;
  long lVar39;
  long lVar40;
  bool bVar41;
  double dVar42;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 *local_128;
  undefined8 *local_120;
  
  RVar12 = NavierStokesBase::gravity;
  iVar11 = ctrl_pseudoGravity;
  RVar10 = ctrl_dV;
  iVar1 = (Scal->super_BaseFab<double>).domain.smallend.vect[0];
  iVar2 = (Scal->super_BaseFab<double>).domain.smallend.vect[1];
  iVar3 = (Scal->super_BaseFab<double>).domain.smallend.vect[2];
  lVar32 = (long)(((Scal->super_BaseFab<double>).domain.bigend.vect[0] - iVar1) + 1);
  lVar28 = (((Scal->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1) * lVar32;
  lVar33 = (long)(((Scal->super_BaseFab<double>).domain.bigend.vect[2] - iVar3) + 1) *
           (long)scalScomp * lVar28;
  pdVar8 = (Scal->super_BaseFab<double>).dptr;
  iVar4 = (force->super_BaseFab<double>).domain.smallend.vect[0];
  lVar20 = (long)iVar4;
  iVar5 = (force->super_BaseFab<double>).domain.smallend.vect[1];
  lVar36 = (long)iVar5;
  lVar37 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
  lVar24 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[1] - iVar5) + 1);
  lVar26 = lVar24 * lVar37;
  iVar4 = (force->super_BaseFab<double>).domain.smallend.vect[2];
  lVar30 = (long)iVar4;
  lVar29 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[2] - iVar4) + 1);
  lVar35 = lVar26 * lVar29;
  lVar31 = (long)scomp;
  lVar39 = lVar35 * lVar31;
  uVar13 = 3;
  if (3 < scomp) {
    uVar13 = (ulong)(uint)scomp;
  }
  lVar21 = (long)(bx->smallend).vect[2];
  lVar22 = (long)(bx->smallend).vect[1];
  iVar4 = (bx->smallend).vect[0];
  lVar23 = (long)iVar4;
  pdVar9 = (force->super_BaseFab<double>).dptr;
  local_138 = (undefined8 *)
              (((lVar21 * 8 + lVar31 * lVar29 * 8 + lVar30 * -8) * lVar24 + lVar22 * 8 + lVar36 * -8
               ) * lVar37 + lVar23 * 8 + lVar20 * -8 + (long)pdVar9);
  local_140 = (undefined8 *)
              ((((uVar13 * 8 + lVar31 * 8) * lVar29 + lVar21 * 8 + lVar30 * -8) * lVar24 +
                lVar22 * 8 + lVar36 * -8) * lVar37 + lVar23 * 8 + lVar20 * -8 + (long)pdVar9);
  dVar42 = ABS(NavierStokesBase::gravity);
  iVar5 = (bx->bigend).vect[0];
  iVar6 = (bx->bigend).vect[1];
  iVar7 = (bx->bigend).vect[2];
  for (; lVar21 <= iVar7; lVar21 = lVar21 + 1) {
    lVar29 = (lVar21 - lVar30) * lVar26;
    lVar31 = (lVar21 - iVar3) * lVar28;
    local_120 = local_140;
    local_128 = local_138;
    for (lVar24 = lVar22; lVar24 <= iVar6; lVar24 = lVar24 + 1) {
      if (iVar4 <= iVar5) {
        lVar14 = (lVar24 - lVar36) * lVar37;
        lVar15 = (lVar24 - iVar2) * lVar32;
        puVar25 = local_128;
        lVar27 = lVar23;
        puVar34 = local_120;
        do {
          if (scomp == 0) {
            lVar40 = lVar27 - lVar20;
            if (dVar42 <= 0.0001) {
              lVar18 = 3;
              puVar17 = puVar25;
              while (bVar41 = lVar18 != 0, lVar18 = lVar18 + -1, bVar41) {
                *puVar17 = 0;
                puVar17 = puVar17 + lVar35;
              }
            }
            else {
              pdVar16 = pdVar9 + lVar39 + lVar29 + lVar14 + lVar40;
              *pdVar16 = 0.0;
              pdVar16[lVar35] = 0.0;
              pdVar16[lVar35 * 2] = pdVar8[lVar33 + lVar31 + lVar15 + (lVar27 - iVar1)] * RVar12;
            }
            if (iVar11 != 0) {
              pdVar9[lVar39 + lVar29 + lVar14 + lVar35 * 2 + lVar40] =
                   pdVar8[lVar33 + lVar31 + lVar15 + (lVar27 - iVar1)] * RVar10 +
                   pdVar9[lVar39 + lVar29 + lVar14 + lVar35 * 2 + lVar40];
            }
          }
          puVar17 = puVar34;
          uVar38 = uVar13;
          if (2 < ncomp + scomp) {
            for (; uVar38 < (uint)(ncomp + scomp); uVar38 = uVar38 + 1) {
              *puVar17 = 0;
              puVar17 = puVar17 + lVar35;
            }
          }
          lVar27 = lVar27 + 1;
          puVar25 = puVar25 + 1;
          puVar34 = puVar34 + 1;
        } while (iVar5 + 1 != (int)lVar27);
      }
      local_128 = local_128 + lVar37;
      local_120 = local_120 + lVar37;
    }
    local_138 = local_138 + lVar26;
    local_140 = local_140 + lVar26;
  }
  if (scomp != 0 || ncomp != 3) {
    return;
  }
  piVar19 = &mfi->currentIndex;
  if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar19 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar19;
  }
  amrex::BaseFab<double>::plus<(amrex::RunOn)0>
            (&force->super_BaseFab<double>,
             &(this->external_sources).super_FabArray<amrex::FArrayBox>.m_fabs_v.
              super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar19]->super_BaseFab<double>,bx,0,0,3);
  return;
}

Assistant:

void
PeleLM::getForce(FArrayBox&       force,
                 const Box&       bx,
                 int              scomp,
                 int              ncomp,
                 const Real       time,
                 const FArrayBox& Vel,
                 const FArrayBox& Scal,
                 int              scalScomp,
                 const MFIter&    mfi)
{
   AMREX_ASSERT(force.box().contains(bx));

   const auto& velocity = Vel.array();
   const auto& scalars  = Scal.array(scalScomp);
   const auto& f        = force.array(scomp);

   const auto  dx       = geom.CellSizeArray();
   const Real  grav     = gravity;

   // Get non-static info for the pseudo gravity forcing
   int pseudo_gravity    = ctrl_pseudoGravity;
   const Real dV_control = ctrl_dV;

   amrex::ParallelFor(bx, [f, scalars, velocity, time, grav, pseudo_gravity, dV_control, dx, scomp, ncomp]
   AMREX_GPU_DEVICE(int i, int j, int k) noexcept
   {
      makeForce(i,j,k, scomp, ncomp, pseudo_gravity, time, grav, dV_control, dx, velocity, scalars, f);
   });
   // Velocity forcing
   if (scomp == Xvel && ncomp == AMREX_SPACEDIM) {
     const FArrayBox& ext_force = external_sources[mfi];
     force.plus<RunOn::Device>(ext_force, bx, Xvel, Xvel, AMREX_SPACEDIM);
   }
}